

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  ImGui_ImplGlfw_Data *pIVar1;
  ImGuiIO *this;
  
  pIVar1 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar1->PrevUserCallbackMousebutton != (GLFWmousebuttonfun)0x0) && (pIVar1->Window == window)
     ) {
    (*pIVar1->PrevUserCallbackMousebutton)(window,button,action,mods);
  }
  ImGui_ImplGlfw_UpdateKeyModifiers(mods);
  this = ImGui::GetIO();
  if ((uint)button < 5) {
    ImGuiIO::AddMouseButtonEvent(this,button,action == 1);
    return;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow* window, int button, int action, int mods)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackMousebutton != nullptr && window == bd->Window)
        bd->PrevUserCallbackMousebutton(window, button, action, mods);

    ImGui_ImplGlfw_UpdateKeyModifiers(mods);

    ImGuiIO& io = ImGui::GetIO();
    if (button >= 0 && button < ImGuiMouseButton_COUNT)
        io.AddMouseButtonEvent(button, action == GLFW_PRESS);
}